

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall cfd::core::DescriptorNode::AnalyzeScriptTree(DescriptorNode *this)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  CfdException *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>,_bool>
  pVar5;
  allocator local_699;
  string local_698;
  CfdSourceLocation local_678;
  CfdSourceLocation local_660;
  _Base_ptr local_648;
  undefined1 local_640;
  allocator local_631;
  string local_630;
  undefined1 local_610 [8];
  DescriptorNode node_2;
  allocator local_471;
  string local_470;
  undefined1 local_450 [8];
  DescriptorNode node_1;
  CfdSourceLocation local_2c0;
  CfdSourceLocation local_2a8;
  string local_290 [32];
  CfdSourceLocation local_270;
  _Base_ptr local_258;
  undefined1 local_250;
  allocator local_241;
  string local_240;
  undefined1 local_220 [8];
  DescriptorNode node;
  string local_a0 [32];
  char *local_80;
  char *str;
  size_t idx;
  string temp_name;
  undefined1 local_48 [4];
  uint32_t tapleaf_count;
  string tapscript;
  size_t offset;
  string *psStack_18;
  uint32_t script_depth;
  string *desc;
  DescriptorNode *this_local;
  
  psStack_18 = &this->value_;
  offset._4_4_ = 0;
  tapscript.field_2._8_8_ = 0;
  desc = &this->name_;
  ::std::__cxx11::string::string((string *)local_48);
  temp_name.field_2._12_4_ = 0;
  ::std::__cxx11::string::string((string *)&idx);
  for (str = (char *)0x0; pcVar4 = str, pcVar2 = (char *)::std::__cxx11::string::size(),
      pcVar4 < pcVar2; str = str + 1) {
    local_80 = (char *)::std::__cxx11::string::operator[]((ulong)psStack_18);
    if ((*local_80 == ' ') || (*local_80 == '{')) {
      if (offset._4_4_ == 0) {
        tapscript.field_2._8_8_ = tapscript.field_2._8_8_ + 1;
      }
    }
    else if ((*local_80 == ',') || (*local_80 == '}')) {
      if (offset._4_4_ == 0) {
        ::std::__cxx11::string::substr((ulong)local_a0,(ulong)psStack_18);
        ::std::__cxx11::string::operator=((string *)local_48,local_a0);
        ::std::__cxx11::string::~string(local_a0);
        uVar3 = ::std::__cxx11::string::length();
        if (uVar3 < 0x40) {
          tapscript.field_2._8_8_ = tapscript.field_2._8_8_ + 1;
        }
        else {
          tapscript.field_2._8_8_ = str + 1;
          DescriptorNode((DescriptorNode *)local_220,&this->addr_prefixes_,this->network_type_);
          ::std::__cxx11::string::operator=((string *)local_220,(string *)&idx);
          node.depth_ = 2;
          ::std::__cxx11::string::operator=
                    ((string *)(node.name_.field_2._M_local_buf + 8),(string *)local_48);
          node.checksum_.field_2._8_4_ = 1;
          ::std::__cxx11::string::operator=
                    ((string *)
                     &node.addr_prefixes_.
                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"tr");
          uVar3 = ::std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            AnalyzeChild((DescriptorNode *)local_220,(string *)local_48,2);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_240,"tr",&local_241);
          AnalyzeAll((DescriptorNode *)local_220,&local_240);
          ::std::__cxx11::string::~string((string *)&local_240);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_241);
          pVar5 = ::std::
                  map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                  ::emplace<std::__cxx11::string&,cfd::core::DescriptorNode&>
                            ((map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                              *)&this->tree_node_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_48,(DescriptorNode *)local_220);
          local_258 = (_Base_ptr)pVar5.first._M_node;
          local_250 = pVar5.second;
          ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
          emplace_back<cfd::core::DescriptorNode&>
                    ((vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
                     &this->child_node_,(DescriptorNode *)local_220);
          temp_name.field_2._12_4_ = temp_name.field_2._12_4_ + 1;
          ::std::__cxx11::string::operator=((string *)local_48,"");
          ::std::__cxx11::string::operator=((string *)&idx,"");
          local_270.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                       ,0x2f);
          local_270.filename = local_270.filename + 1;
          local_270.line = 0x60e;
          local_270.funcname = "AnalyzeScriptTree";
          logger::info<unsigned_int&,std::__cxx11::string&>
                    (&local_270,"HashTarget script_depth={}, child.value={}",
                     (uint *)((long)&offset + 4),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&node.name_.field_2 + 8));
          ~DescriptorNode((DescriptorNode *)local_220);
        }
      }
    }
    else if (*local_80 == '(') {
      if (offset._4_4_ == 0) {
        ::std::__cxx11::string::substr((ulong)local_290,(ulong)psStack_18);
        ::std::__cxx11::string::operator=((string *)&idx,local_290);
        ::std::__cxx11::string::~string(local_290);
      }
      local_2a8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_2a8.filename = local_2a8.filename + 1;
      local_2a8.line = 0x61a;
      local_2a8.funcname = "AnalyzeScriptTree";
      logger::info<unsigned_int&,std::__cxx11::string&>
                (&local_2a8,"Target`(` script_depth={}, name={}",(uint *)((long)&offset + 4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx);
      offset._4_4_ = offset._4_4_ + 1;
    }
    else if (*local_80 == ')') {
      offset._4_4_ = offset._4_4_ + -1;
      local_2c0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_2c0.filename = local_2c0.filename + 1;
      local_2c0.line = 0x61f;
      local_2c0.funcname = "AnalyzeScriptTree";
      logger::info<unsigned_int&>
                (&local_2c0,"Target`)` script_depth = {}",(uint *)((long)&offset + 4));
      if (offset._4_4_ == 0) {
        ::std::__cxx11::string::substr((ulong)&node_1.network_type_,(ulong)psStack_18);
        ::std::__cxx11::string::operator=((string *)local_48,(string *)&node_1.network_type_);
        ::std::__cxx11::string::~string((string *)&node_1.network_type_);
        tapscript.field_2._8_8_ = str + 1;
        DescriptorNode((DescriptorNode *)local_450,&this->addr_prefixes_,this->network_type_);
        ::std::__cxx11::string::operator=((string *)local_450,(string *)&idx);
        node_1.depth_ = 1;
        ::std::__cxx11::string::operator=
                  ((string *)(node_1.name_.field_2._M_local_buf + 8),(string *)local_48);
        node_1.checksum_.field_2._8_4_ = 1;
        ::std::__cxx11::string::operator=
                  ((string *)
                   &node_1.addr_prefixes_.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"tr");
        uVar3 = ::std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          AnalyzeChild((DescriptorNode *)local_450,(string *)local_48,2);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_470,"tr",&local_471);
        AnalyzeAll((DescriptorNode *)local_450,&local_470);
        ::std::__cxx11::string::~string((string *)&local_470);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_471);
        ::std::
        map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
        ::emplace<std::__cxx11::string&,cfd::core::DescriptorNode&>
                  ((map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                    *)&this->tree_node_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   (DescriptorNode *)local_450);
        ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
        emplace_back<cfd::core::DescriptorNode&>
                  ((vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
                   &this->child_node_,(DescriptorNode *)local_450);
        temp_name.field_2._12_4_ = temp_name.field_2._12_4_ + 1;
        ::std::__cxx11::string::operator=((string *)local_48,"");
        ::std::__cxx11::string::operator=((string *)&idx,"");
        pcVar4 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
        node_2._360_8_ = pcVar4 + 1;
        logger::info<unsigned_int&,std::__cxx11::string&>
                  ((CfdSourceLocation *)&node_2.network_type_,
                   "Target`)` script_depth={}, child.value={}",(uint *)((long)&offset + 4),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_1.name_.field_2 + 8));
        ~DescriptorNode((DescriptorNode *)local_450);
      }
    }
  }
  bVar1 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
          ::empty(&this->tree_node_);
  if (bVar1) {
    uVar3 = ::std::__cxx11::string::length();
    if (uVar3 < 0x40) {
      local_678.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_678.filename = local_678.filename + 1;
      local_678.line = 0x64e;
      local_678.funcname = "AnalyzeScriptTree";
      logger::warn<>(&local_678,"Failed to taproot. empty script.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_698,"Failed to taproot. empty script.",&local_699);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_698);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::operator=((string *)local_48,(string *)&this->value_);
    DescriptorNode((DescriptorNode *)local_610,&this->addr_prefixes_,this->network_type_);
    ::std::__cxx11::string::operator=((string *)local_610,(string *)&idx);
    node_2.depth_ = 2;
    ::std::__cxx11::string::operator=
              ((string *)(node_2.name_.field_2._M_local_buf + 8),(string *)local_48);
    node_2.checksum_.field_2._8_4_ = 1;
    ::std::__cxx11::string::operator=
              ((string *)
               &node_2.addr_prefixes_.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"tr");
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      AnalyzeChild((DescriptorNode *)local_610,(string *)local_48,2);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_630,"tr",&local_631);
    AnalyzeAll((DescriptorNode *)local_610,&local_630);
    ::std::__cxx11::string::~string((string *)&local_630);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_631);
    pVar5 = ::std::
            map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
            ::emplace<std::__cxx11::string&,cfd::core::DescriptorNode&>
                      ((map<std::__cxx11::string,cfd::core::DescriptorNode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                        *)&this->tree_node_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,(DescriptorNode *)local_610);
    local_648 = (_Base_ptr)pVar5.first._M_node;
    local_640 = pVar5.second;
    ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
    emplace_back<cfd::core::DescriptorNode&>
              ((vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
               &this->child_node_,(DescriptorNode *)local_610);
    temp_name.field_2._12_4_ = temp_name.field_2._12_4_ + 1;
    ::std::__cxx11::string::operator=((string *)local_48,"");
    ::std::__cxx11::string::operator=((string *)&idx,"");
    local_660.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_660.filename = local_660.filename + 1;
    local_660.line = 0x64b;
    local_660.funcname = "AnalyzeScriptTree";
    logger::info<unsigned_int&,std::__cxx11::string&>
              (&local_660,"LastTarget script_depth={}, child.value={}",(uint *)((long)&offset + 4),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&node_2.name_.field_2 + 8));
    ~DescriptorNode((DescriptorNode *)local_610);
  }
  ::std::__cxx11::string::~string((string *)&idx);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void DescriptorNode::AnalyzeScriptTree() {
  const auto& desc = value_;

  uint32_t script_depth = 0;
  size_t offset = 0;
  std::string tapscript;
  uint32_t tapleaf_count = 0;
  std::string temp_name;
  for (size_t idx = 0; idx < desc.size(); ++idx) {
    const char& str = desc[idx];
    if ((str == ' ') || (str == '{')) {
      if (script_depth == 0) ++offset;
    } else if ((str == ',') || (str == '}')) {
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset);
        if (tapscript.length() >= (kByteData256Length * 2)) {
          offset = idx + 1;
          DescriptorNode node(addr_prefixes_, network_type_);
          node.name_ = temp_name;
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
          node.value_ = tapscript;
          node.depth_ = 1;
          node.parent_kind_ = "tr";
          if (!temp_name.empty()) {
            node.AnalyzeChild(tapscript, 2);
          }
          node.AnalyzeAll("tr");
          tree_node_.emplace(tapscript, node);
          child_node_.emplace_back(node);
          ++tapleaf_count;
          tapscript = "";
          temp_name = "";
          info(
              CFD_LOG_SOURCE, "HashTarget script_depth={}, child.value={}",
              script_depth, node.value_);
        } else {
          ++offset;
        }
      }
    } else if (str == '(') {
      if (script_depth == 0) {
        temp_name = desc.substr(offset, idx - offset);
        // offset = idx + 1;
      }
      info(
          CFD_LOG_SOURCE, "Target`(` script_depth={}, name={}", script_depth,
          temp_name);
      ++script_depth;
    } else if (str == ')') {
      --script_depth;
      info(CFD_LOG_SOURCE, "Target`)` script_depth = {}", script_depth);
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset + 1);
        offset = idx + 1;
        DescriptorNode node(addr_prefixes_, network_type_);
        node.name_ = temp_name;
        node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
        node.value_ = tapscript;
        node.depth_ = 1;
        node.parent_kind_ = "tr";
        if (!temp_name.empty()) {
          node.AnalyzeChild(tapscript, 2);
        }
        node.AnalyzeAll("tr");
        tree_node_.emplace(tapscript, node);
        child_node_.emplace_back(node);
        ++tapleaf_count;
        tapscript = "";
        temp_name = "";
        info(
            CFD_LOG_SOURCE, "Target`)` script_depth={}, child.value={}",
            script_depth, node.value_);
      }
    }
  }
  if (tree_node_.empty()) {
    if (value_.length() >= (kByteData256Length * 2)) {
      tapscript = value_;
      DescriptorNode node(addr_prefixes_, network_type_);
      node.name_ = temp_name;
      node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
      node.value_ = tapscript;
      node.depth_ = 1;
      node.parent_kind_ = "tr";
      if (!temp_name.empty()) {
        node.AnalyzeChild(tapscript, 2);
      }
      node.AnalyzeAll("tr");
      tree_node_.emplace(tapscript, node);
      child_node_.emplace_back(node);
      ++tapleaf_count;
      tapscript = "";
      temp_name = "";
      info(
          CFD_LOG_SOURCE, "LastTarget script_depth={}, child.value={}",
          script_depth, node.value_);
    } else {
      warn(CFD_LOG_SOURCE, "Failed to taproot. empty script.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot. empty script.");
    }
  }
}